

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_path_or_unary_expression(xpath_parser *this)

{
  xpath_lexer *this_00;
  lexeme_t lVar1;
  xpath_value_type xVar2;
  xpath_variable_set *this_01;
  bool *pbVar3;
  bool bVar4;
  char cVar5;
  byte bVar6;
  nodetest_t nVar7;
  char_t *pcVar8;
  xpath_ast_node *pxVar9;
  xpath_variable *__dest;
  char_t *pcVar10;
  xpath_parse_result *pxVar11;
  xpath_ast_node *pxVar12;
  xpath_ast_node *pxVar13;
  byte *pbVar14;
  char *pcVar15;
  xpath_ast_node **ppxVar16;
  ulong uVar17;
  xpath_ast_node *unaff_R15;
  size_t __n;
  xpath_ast_node *args [2];
  xpath_ast_node *local_58 [2];
  xpath_lexer_string local_48;
  char_t *local_38;
  
  lVar1 = (this->_lexer)._cur_lexeme;
  if (lex_string < lVar1) {
LAB_00112618:
    pxVar12 = parse_location_path(this);
    return pxVar12;
  }
  this_00 = &this->_lexer;
  if ((0xd800U >> (lVar1 & (lex_double_dot|lex_plus)) & 1) == 0) {
    if (lVar1 == lex_minus) {
      xpath_lexer::next(this_00);
      pxVar12 = parse_expression(this,7);
      if (pxVar12 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar9 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar9 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar9->_type = '\x0e';
      pxVar9->_rettype = '\x02';
      pxVar9->_axis = '\0';
      pxVar9->_test = '\0';
      pxVar9->_left = pxVar12;
      pxVar9->_right = (xpath_ast_node *)0x0;
      pxVar9->_next = (xpath_ast_node *)0x0;
      return pxVar9;
    }
    if (lVar1 != lex_string) goto LAB_00112618;
    pbVar14 = this_00->_cur;
    do {
      bVar6 = *pbVar14;
      pbVar14 = pbVar14 + 1;
    } while (((ulong)((xpath_lexer_string *)(ulong)bVar6)[0x1187d].begin & 8) != 0);
    if ((bVar6 == 0x28) &&
       (nVar7 = parse_node_test_type
                          ((xpath_parser *)&(this->_lexer)._cur_lexeme_contents,
                           (xpath_lexer_string *)(ulong)bVar6), nVar7 == nodetest_none)) {
      bVar4 = true;
    }
    else {
      unaff_R15 = parse_location_path(this);
      bVar4 = false;
    }
    if (!bVar4) {
      return unaff_R15;
    }
  }
  switch((this->_lexer)._cur_lexeme) {
  case lex_var_ref:
    this_01 = this->_variables;
    if (this_01 == (xpath_variable_set *)0x0) {
      pxVar11 = this->_result;
      pcVar15 = "Unknown variable: variable set is not provided";
    }
    else {
      pcVar10 = (this->_lexer)._cur_lexeme_contents.begin;
      pcVar8 = this->_scratch;
      uVar17 = (long)(this->_lexer)._cur_lexeme_contents.end - (long)pcVar10;
      local_38 = pcVar8;
      if ((uVar17 < 0x20) ||
         (pcVar8 = (char_t *)
                   (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                             allocate)(uVar17 + 1), pcVar8 != (char_t *)0x0)) {
        memcpy(pcVar8,pcVar10,uVar17);
        pcVar8[uVar17] = '\0';
        __dest = xpath_variable_set::_find(this_01,pcVar8);
        bVar4 = true;
        if (pcVar8 != local_38) {
          (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                    (pcVar8);
        }
      }
      else {
        __dest = (xpath_variable *)0x0;
        bVar4 = false;
      }
      if (!bVar4) goto LAB_001129bb;
      if (__dest != (xpath_variable *)0x0) {
        xpath_lexer::next(this_00);
        xVar2 = __dest->_type;
        pxVar9 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar9 != (xpath_ast_node *)0x0) {
          pxVar9->_type = '\x14';
          pxVar9->_rettype = (char)xVar2;
          pxVar9->_axis = '\0';
          pxVar9->_test = '\0';
          goto LAB_001129a0;
        }
        goto LAB_00113246;
      }
      pxVar11 = this->_result;
      pcVar15 = "Unknown variable: variable set does not contain the given name";
    }
    break;
  case lex_open_brace:
    xpath_lexer::next(this_00);
    pxVar12 = parse_expression(this,0);
    pxVar9 = (xpath_ast_node *)0x0;
    if (pxVar12 != (xpath_ast_node *)0x0) {
      if ((this->_lexer)._cur_lexeme != lex_close_brace) {
        pxVar11 = this->_result;
        pcVar15 = "Expected \')\' to match an opening \'(\'";
        break;
      }
      xpath_lexer::next(this_00);
      pxVar9 = pxVar12;
    }
    goto LAB_00113249;
  default:
    pxVar11 = this->_result;
    pcVar15 = "Unrecognizable primary expression";
    break;
  case lex_quoted_string:
    pcVar8 = (this->_lexer)._cur_lexeme_contents.begin;
    if (pcVar8 == (char_t *)0x0) {
      __dest = (xpath_variable *)0x119371;
    }
    else {
      __n = (long)(this->_lexer)._cur_lexeme_contents.end - (long)pcVar8;
      __dest = (xpath_variable *)xpath_allocator::allocate(this->_alloc,__n + 1);
      if (__dest == (xpath_variable *)0x0) {
        __dest = (xpath_variable *)0x0;
      }
      else {
        memcpy(__dest,(this->_lexer)._cur_lexeme_contents.begin,__n);
        *(char *)((long)__dest + __n) = '\0';
      }
    }
    if (__dest != (xpath_variable *)0x0) {
      xpath_lexer::next(this_00);
      pxVar9 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar9 != (xpath_ast_node *)0x0) {
        pxVar9->_type = '\x12';
        pxVar9->_rettype = '\x03';
        pxVar9->_axis = '\0';
        pxVar9->_test = '\0';
LAB_001129a0:
        pxVar9->_left = (xpath_ast_node *)0x0;
        pxVar9->_right = (xpath_ast_node *)0x0;
        pxVar9->_next = (xpath_ast_node *)0x0;
        (pxVar9->_data).string = (char_t *)__dest;
        goto LAB_00113249;
      }
    }
    goto LAB_00113246;
  case lex_number:
    pcVar8 = (this->_lexer)._cur_lexeme_contents.begin;
    uVar17 = (long)(this->_lexer)._cur_lexeme_contents.end - (long)pcVar8;
    pcVar10 = this->_scratch;
    if ((uVar17 < 0x20) ||
       (pcVar10 = (char_t *)
                  (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                            allocate)(uVar17 + 1), pcVar10 != (char_t *)0x0)) {
      memcpy(pcVar10,pcVar8,uVar17);
      pcVar10[uVar17] = '\0';
      local_38 = (char_t *)convert_string_to_number(pcVar10);
      bVar4 = true;
      if (pcVar10 != this->_scratch) {
        (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                  (pcVar10);
      }
    }
    else {
      local_38 = (char_t *)0x0;
      bVar4 = false;
    }
    if (bVar4) {
      xpath_lexer::next(this_00);
      pxVar9 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar9 != (xpath_ast_node *)0x0) {
        pxVar9->_type = '\x13';
        pxVar9->_rettype = '\x02';
        pxVar9->_axis = '\0';
        pxVar9->_test = '\0';
        pxVar9->_left = (xpath_ast_node *)0x0;
        pxVar9->_right = (xpath_ast_node *)0x0;
        pxVar9->_next = (xpath_ast_node *)0x0;
        (pxVar9->_data).number = (double)local_38;
        goto LAB_00113249;
      }
    }
    else {
LAB_001129bb:
      pbVar3 = this->_alloc->_error;
      if (pbVar3 == (bool *)0x0) {
        __assert_fail("_alloc->_error",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                      ,0x2b77,
                      "xpath_ast_node *pugi::impl::(anonymous namespace)::xpath_parser::error_oom()"
                     );
      }
      *pbVar3 = true;
    }
    goto LAB_00113246;
  case lex_string:
    local_58[0] = (xpath_ast_node *)0x0;
    local_58[1] = (xpath_ast_node *)0x0;
    local_48.begin = (this->_lexer)._cur_lexeme_contents.begin;
    local_48.end = (this->_lexer)._cur_lexeme_contents.end;
    xpath_lexer::next(this_00);
    if ((this->_lexer)._cur_lexeme == lex_open_brace) {
      xpath_lexer::next(this_00);
      pxVar9 = (xpath_ast_node *)0x0;
      uVar17 = 0;
      pxVar12 = (xpath_ast_node *)0x0;
      while (lVar1 = (this->_lexer)._cur_lexeme, lVar1 != lex_close_brace) {
        if (uVar17 != 0) {
          if (lVar1 == lex_comma) {
            xpath_lexer::next(this_00);
            goto LAB_001127cf;
          }
          pxVar11 = this->_result;
          pcVar15 = "No comma between function arguments";
          goto LAB_00113237;
        }
LAB_001127cf:
        pxVar13 = parse_expression(this,0);
        if (pxVar13 != (xpath_ast_node *)0x0) {
          ppxVar16 = local_58 + uVar17;
          if (1 < uVar17) {
            ppxVar16 = &pxVar12->_next;
          }
          *ppxVar16 = pxVar13;
          uVar17 = uVar17 + 1;
          pxVar12 = pxVar13;
        }
        if (pxVar13 == (xpath_ast_node *)0x0) goto LAB_00113249;
      }
      xpath_lexer::next(this_00);
      switch(*local_48.begin) {
      case 'b':
        bVar4 = xpath_lexer_string::operator==(&local_48,(char_t *)"boolean");
        pxVar12 = local_58[0];
        if ((uVar17 != 1) || (!bVar4)) break;
        pxVar9 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar9 != (xpath_ast_node *)0x0) {
          pxVar9->_type = '-';
          pxVar9->_rettype = '\x04';
          pxVar9->_axis = '\0';
          pxVar9->_test = '\0';
          goto LAB_00113093;
        }
        goto LAB_00113246;
      case 'c':
        bVar4 = xpath_lexer_string::operator==(&local_48,"count");
        pxVar12 = local_58[0];
        if ((uVar17 == 1) && (bVar4)) {
          if (local_58[0]->_rettype != '\x01') goto LAB_001133c6;
          pxVar9 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar9 != (xpath_ast_node *)0x0) {
            pxVar9->_type = '\x17';
            pxVar9->_rettype = '\x02';
            pxVar9->_axis = '\0';
            pxVar9->_test = '\0';
            goto LAB_00113093;
          }
          goto LAB_00113246;
        }
        bVar4 = xpath_lexer_string::operator==(&local_48,(char_t *)"contains");
        pxVar13 = local_58[1];
        pxVar12 = local_58[0];
        if ((uVar17 == 2) && (bVar4)) {
          pxVar9 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar9 == (xpath_ast_node *)0x0) goto LAB_00113246;
          pxVar9->_type = '#';
          pxVar9->_rettype = '\x04';
          pxVar9->_axis = '\0';
          pxVar9->_test = '\0';
        }
        else {
          bVar4 = xpath_lexer_string::operator==(&local_48,(char_t *)"concat");
          pxVar13 = local_58[1];
          pxVar12 = local_58[0];
          if ((uVar17 < 2) || (!bVar4)) {
            bVar4 = xpath_lexer_string::operator==(&local_48,(char_t *)"ceiling");
            pxVar12 = local_58[0];
            if ((uVar17 != 1) || (!bVar4)) break;
            pxVar9 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
            if (pxVar9 != (xpath_ast_node *)0x0) {
              pxVar9->_type = '6';
              pxVar9->_rettype = '\x02';
              pxVar9->_axis = '\0';
              pxVar9->_test = '\0';
              goto LAB_00113093;
            }
            goto LAB_00113246;
          }
          pxVar9 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar9 == (xpath_ast_node *)0x0) goto LAB_00113246;
          pxVar9->_type = '!';
          pxVar9->_rettype = '\x03';
          pxVar9->_axis = '\0';
          pxVar9->_test = '\0';
        }
LAB_0011317e:
        pxVar9->_left = pxVar12;
        pxVar9->_right = pxVar13;
LAB_00113186:
        pxVar9->_next = (xpath_ast_node *)0x0;
        goto LAB_00113249;
      case 'f':
        bVar4 = xpath_lexer_string::operator==(&local_48,(char_t *)"false");
        if ((uVar17 == 0) && (bVar4)) {
          pxVar9 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar9 != (xpath_ast_node *)0x0) {
            pxVar9->_type = '0';
            pxVar9->_rettype = '\x04';
            pxVar9->_axis = '\0';
            pxVar9->_test = '\0';
LAB_00112e22:
            pxVar9->_left = (xpath_ast_node *)0x0;
            pxVar9->_right = (xpath_ast_node *)0x0;
            goto LAB_00113186;
          }
          goto LAB_00113246;
        }
        bVar4 = xpath_lexer_string::operator==(&local_48,(char_t *)"floor");
        pxVar12 = local_58[0];
        if ((uVar17 == 1) && (bVar4)) {
          pxVar9 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar9 != (xpath_ast_node *)0x0) {
            pxVar9->_type = '5';
            pxVar9->_rettype = '\x02';
            pxVar9->_axis = '\0';
            pxVar9->_test = '\0';
            goto LAB_00113093;
          }
          goto LAB_00113246;
        }
        break;
      case 'i':
        bVar4 = xpath_lexer_string::operator==(&local_48,"id");
        pxVar12 = local_58[0];
        if ((uVar17 != 1) || (!bVar4)) break;
        pxVar9 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar9 != (xpath_ast_node *)0x0) {
          pxVar9->_type = '\x18';
          pxVar9->_rettype = '\x01';
          pxVar9->_axis = '\0';
          pxVar9->_test = '\0';
          goto LAB_00113093;
        }
        goto LAB_00113246;
      case 'l':
        bVar4 = xpath_lexer_string::operator==(&local_48,(char_t *)"last");
        if ((uVar17 == 0) && (bVar4)) {
          pxVar9 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar9 != (xpath_ast_node *)0x0) {
            pxVar9->_type = '\x15';
            pxVar9->_rettype = '\x02';
            pxVar9->_axis = '\0';
            pxVar9->_test = '\0';
            goto LAB_00112e22;
          }
          goto LAB_00113246;
        }
        bVar4 = xpath_lexer_string::operator==(&local_48,"lang");
        pxVar12 = local_58[0];
        if ((uVar17 == 1) && (bVar4)) {
          pxVar9 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar9 != (xpath_ast_node *)0x0) {
            pxVar9->_type = '1';
            pxVar9->_rettype = '\x04';
            pxVar9->_axis = '\0';
            pxVar9->_test = '\0';
            goto LAB_00113093;
          }
          goto LAB_00113246;
        }
        bVar4 = xpath_lexer_string::operator==(&local_48,(char_t *)"local-name");
        pxVar12 = local_58[0];
        if ((uVar17 < 2) && (bVar4)) {
          if ((uVar17 == 1) && (local_58[0]->_rettype != '\x01')) goto LAB_001133c6;
          pxVar9 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar9 != (xpath_ast_node *)0x0) {
            cVar5 = '\x1a';
            goto LAB_00112f9b;
          }
          goto LAB_00113246;
        }
        break;
      case 'n':
        bVar4 = xpath_lexer_string::operator==(&local_48,"name");
        pxVar12 = local_58[0];
        if ((uVar17 < 2) && (bVar4)) {
          if ((uVar17 != 1) || (local_58[0]->_rettype == '\x01')) {
            pxVar9 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
            if (pxVar9 != (xpath_ast_node *)0x0) {
              cVar5 = '\x1e';
              goto LAB_00112f9b;
            }
            goto LAB_00113246;
          }
        }
        else {
          bVar4 = xpath_lexer_string::operator==(&local_48,(char_t *)"namespace-uri");
          pxVar12 = local_58[0];
          if ((1 < uVar17) || (!bVar4)) {
            bVar4 = xpath_lexer_string::operator==(&local_48,(char_t *)"normalize-space");
            pxVar13 = local_58[1];
            pxVar12 = local_58[0];
            if ((uVar17 < 2) && (bVar4)) {
              pxVar9 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
              if (pxVar9 != (xpath_ast_node *)0x0) {
                bVar6 = uVar17 == 0 ^ 0x2b;
LAB_00112ed5:
                pxVar9->_type = bVar6;
                pxVar9->_rettype = '\x03';
                pxVar9->_axis = '\0';
                pxVar9->_test = '\0';
                pxVar9->_left = pxVar12;
                pxVar9->_right = pxVar13;
                goto LAB_00113186;
              }
            }
            else {
              bVar4 = xpath_lexer_string::operator==(&local_48,(char_t *)"not");
              pxVar12 = local_58[0];
              if ((uVar17 == 1) && (bVar4)) {
                pxVar9 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
                if (pxVar9 != (xpath_ast_node *)0x0) {
                  pxVar9->_type = '.';
                  pxVar9->_rettype = '\x04';
                  pxVar9->_axis = '\0';
                  pxVar9->_test = '\0';
                  goto LAB_00113093;
                }
              }
              else {
                bVar4 = xpath_lexer_string::operator==(&local_48,"number");
                pxVar12 = local_58[0];
                if ((1 < uVar17) || (!bVar4)) break;
                pxVar9 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
                if (pxVar9 != (xpath_ast_node *)0x0) {
                  bVar6 = uVar17 == 0 ^ 0x33;
                  goto LAB_00112e79;
                }
              }
            }
            goto LAB_00113246;
          }
          if ((uVar17 != 1) || (local_58[0]->_rettype == '\x01')) {
            pxVar9 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
            if (pxVar9 != (xpath_ast_node *)0x0) {
              cVar5 = '\x1c';
              goto LAB_00112f9b;
            }
            goto LAB_00113246;
          }
        }
LAB_001133c6:
        pxVar11 = this->_result;
        pcVar15 = "Function has to be applied to node set";
        goto LAB_00113237;
      case 'p':
        bVar4 = xpath_lexer_string::operator==(&local_48,(char_t *)"position");
        if ((uVar17 == 0) && (bVar4)) {
          pxVar9 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar9 != (xpath_ast_node *)0x0) {
            pxVar9->_type = '\x16';
            pxVar9->_rettype = '\x02';
            pxVar9->_axis = '\0';
            pxVar9->_test = '\0';
            goto LAB_00112e22;
          }
          goto LAB_00113246;
        }
        break;
      case 'r':
        bVar4 = xpath_lexer_string::operator==(&local_48,(char_t *)"round");
        pxVar12 = local_58[0];
        if ((uVar17 != 1) || (!bVar4)) break;
        pxVar9 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar9 == (xpath_ast_node *)0x0) goto LAB_00113246;
        pxVar9->_type = '7';
        pxVar9->_rettype = '\x02';
        pxVar9->_axis = '\0';
        pxVar9->_test = '\0';
LAB_00113093:
        pxVar9->_left = pxVar12;
LAB_00113097:
        pxVar9->_right = (xpath_ast_node *)0x0;
        pxVar9->_next = (xpath_ast_node *)0x0;
        goto LAB_00113249;
      case 's':
        bVar4 = xpath_lexer_string::operator==(&local_48,"string");
        pxVar12 = local_58[0];
        if ((uVar17 < 2) && (bVar4)) {
          pxVar9 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar9 == (xpath_ast_node *)0x0) goto LAB_00113246;
          cVar5 = ' ';
LAB_00112f9b:
          pxVar9->_type = cVar5 - (uVar17 == 0);
          pxVar9->_rettype = '\x03';
          pxVar9->_axis = '\0';
        }
        else {
          bVar4 = xpath_lexer_string::operator==(&local_48,(char_t *)"string-length");
          pxVar12 = local_58[0];
          if ((1 < uVar17) || (!bVar4)) {
            bVar4 = xpath_lexer_string::operator==(&local_48,(char_t *)"starts-with");
            pxVar13 = local_58[1];
            pxVar12 = local_58[0];
            if ((uVar17 == 2) && (bVar4)) {
              pxVar9 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
              if (pxVar9 != (xpath_ast_node *)0x0) {
                pxVar9->_type = '\"';
                pxVar9->_rettype = '\x04';
                pxVar9->_axis = '\0';
                pxVar9->_test = '\0';
                goto LAB_0011317e;
              }
              goto LAB_00113246;
            }
            bVar4 = xpath_lexer_string::operator==(&local_48,(char_t *)"substring-before");
            pxVar13 = local_58[1];
            pxVar12 = local_58[0];
            if ((uVar17 == 2) && (bVar4)) {
              pxVar9 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
              if (pxVar9 == (xpath_ast_node *)0x0) goto LAB_00113246;
              pxVar9->_type = '$';
              pxVar9->_rettype = '\x03';
              pxVar9->_axis = '\0';
              pxVar9->_test = '\0';
            }
            else {
              bVar4 = xpath_lexer_string::operator==(&local_48,(char_t *)"substring-after");
              pxVar13 = local_58[1];
              pxVar12 = local_58[0];
              if ((uVar17 != 2) || (!bVar4)) {
                bVar4 = xpath_lexer_string::operator==(&local_48,(char_t *)"substring");
                pxVar13 = local_58[1];
                pxVar12 = local_58[0];
                if (((uVar17 & 0xfffffffffffffffe) == 2) && (bVar4)) {
                  pxVar9 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
                  if (pxVar9 != (xpath_ast_node *)0x0) {
                    bVar6 = uVar17 == 2 ^ 0x27;
                    goto LAB_00112ed5;
                  }
                }
                else {
                  bVar4 = xpath_lexer_string::operator==(&local_48,(char_t *)"sum");
                  pxVar12 = local_58[0];
                  if ((uVar17 != 1) || (!bVar4)) break;
                  if (local_58[0]->_rettype != '\x01') goto LAB_001133c6;
                  pxVar9 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
                  if (pxVar9 != (xpath_ast_node *)0x0) {
                    pxVar9->_type = '4';
                    pxVar9->_rettype = '\x02';
                    pxVar9->_axis = '\0';
                    pxVar9->_test = '\0';
                    goto LAB_00113093;
                  }
                }
                goto LAB_00113246;
              }
              pxVar9 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
              if (pxVar9 == (xpath_ast_node *)0x0) goto LAB_00113246;
              pxVar9->_type = '%';
              pxVar9->_rettype = '\x03';
              pxVar9->_axis = '\0';
              pxVar9->_test = '\0';
            }
            goto LAB_0011317e;
          }
          pxVar9 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar9 == (xpath_ast_node *)0x0) goto LAB_00113246;
          bVar6 = uVar17 == 0 ^ 0x29;
LAB_00112e79:
          pxVar9->_type = bVar6;
          pxVar9->_rettype = '\x02';
          pxVar9->_axis = '\0';
        }
        pxVar9->_test = '\0';
        pxVar9->_left = pxVar12;
        goto LAB_00113097;
      case 't':
        bVar4 = xpath_lexer_string::operator==(&local_48,(char_t *)"translate");
        pxVar13 = local_58[1];
        pxVar12 = local_58[0];
        if ((uVar17 == 3) && (bVar4)) {
          pxVar9 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar9 != (xpath_ast_node *)0x0) {
            pxVar9->_type = ',';
            pxVar9->_rettype = '\x03';
            pxVar9->_axis = '\0';
            pxVar9->_test = '\0';
            goto LAB_0011317e;
          }
          goto LAB_00113246;
        }
        bVar4 = xpath_lexer_string::operator==(&local_48,(char_t *)"true");
        if ((uVar17 == 0) && (bVar4)) {
          pxVar9 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar9 != (xpath_ast_node *)0x0) {
            pxVar9->_type = '/';
            pxVar9->_rettype = '\x04';
            pxVar9->_axis = '\0';
            pxVar9->_test = '\0';
            goto LAB_00112e22;
          }
          goto LAB_00113246;
        }
      }
      pxVar11 = this->_result;
      pcVar15 = "Unrecognized function or wrong parameter count";
      break;
    }
    pxVar11 = this->_result;
    pcVar15 = "Unrecognized function call";
  }
LAB_00113237:
  pxVar11->error = pcVar15;
  pxVar11->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
LAB_00113246:
  pxVar9 = (xpath_ast_node *)0x0;
LAB_00113249:
  if (pxVar9 != (xpath_ast_node *)0x0) {
    do {
      if ((this->_lexer)._cur_lexeme != lex_open_square_brace) goto LAB_00113314;
      xpath_lexer::next(this_00);
      if (pxVar9->_rettype != '\x01') {
        pxVar11 = this->_result;
        pxVar11->error = "Predicate has to be applied to node set";
        pxVar11->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
        break;
      }
      bVar4 = false;
      pxVar12 = parse_expression(this,0);
      if (pxVar12 != (xpath_ast_node *)0x0) {
        pxVar13 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar13 == (xpath_ast_node *)0x0) {
          pxVar9 = (xpath_ast_node *)0x0;
        }
        else {
          pxVar13->_type = '\x11';
          pxVar13->_rettype = '\x01';
          pxVar13->_axis = '\0';
          pxVar13->_test = '\0';
          pxVar13->_left = pxVar9;
          pxVar13->_right = pxVar12;
          pxVar13->_next = (xpath_ast_node *)0x0;
          pxVar9 = pxVar13;
        }
        if (pxVar9 == (xpath_ast_node *)0x0) {
          pxVar9 = (xpath_ast_node *)0x0;
        }
        else {
          if ((this->_lexer)._cur_lexeme == lex_close_square_brace) {
            xpath_lexer::next(this_00);
            bVar4 = true;
            goto LAB_001132ec;
          }
          pxVar11 = this->_result;
          pxVar11->error = "Expected \']\' to match an opening \'[\'";
          pxVar11->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
        }
        bVar4 = false;
      }
LAB_001132ec:
    } while (bVar4);
  }
  pxVar9 = (xpath_ast_node *)0x0;
LAB_00113314:
  if (pxVar9 != (xpath_ast_node *)0x0) {
    lVar1 = (this->_lexer)._cur_lexeme;
    if ((lVar1 & ~lex_equal) != lex_slash) {
      return pxVar9;
    }
    xpath_lexer::next(this_00);
    pxVar12 = pxVar9;
    if (lVar1 != lex_double_slash) {
LAB_00113398:
      pxVar12 = parse_relative_location_path(this,pxVar12);
      return pxVar12;
    }
    if (pxVar9->_rettype == '\x01') {
      pxVar12 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar12 == (xpath_ast_node *)0x0) {
        pxVar12 = (xpath_ast_node *)0x0;
      }
      else {
        pxVar12->_type = '8';
        pxVar12->_rettype = '\x01';
        pxVar12->_axis = '\x05';
        pxVar12->_test = '\x02';
        pxVar12->_left = pxVar9;
        pxVar12->_right = (xpath_ast_node *)0x0;
        pxVar12->_next = (xpath_ast_node *)0x0;
        (pxVar12->_data).string = (char_t *)0x0;
      }
      if (pxVar12 != (xpath_ast_node *)0x0) goto LAB_00113398;
    }
    else {
      pxVar11 = this->_result;
      pxVar11->error = "Step has to be applied to node set";
      pxVar11->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
    }
  }
  return (xpath_ast_node *)0x0;
}

Assistant:

xpath_ast_node* parse_path_or_unary_expression()
		{
			// Clarification.
			// PathExpr begins with either LocationPath or FilterExpr.
			// FilterExpr begins with PrimaryExpr
			// PrimaryExpr begins with '$' in case of it being a variable reference,
			// '(' in case of it being an expression, string literal, number constant or
			// function call.
			if (_lexer.current() == lex_var_ref || _lexer.current() == lex_open_brace ||
				_lexer.current() == lex_quoted_string || _lexer.current() == lex_number ||
				_lexer.current() == lex_string)
			{
				if (_lexer.current() == lex_string)
				{
					// This is either a function call, or not - if not, we shall proceed with location path
					const char_t* state = _lexer.state();

					while (PUGI__IS_CHARTYPE(*state, ct_space)) ++state;

					if (*state != '(')
						return parse_location_path();

					// This looks like a function call; however this still can be a node-test. Check it.
					if (parse_node_test_type(_lexer.contents()) != nodetest_none)
						return parse_location_path();
				}

				xpath_ast_node* n = parse_filter_expression();
				if (!n) return 0;

				if (_lexer.current() == lex_slash || _lexer.current() == lex_double_slash)
				{
					lexeme_t l = _lexer.current();
					_lexer.next();

					if (l == lex_double_slash)
					{
						if (n->rettype() != xpath_type_node_set)
							return error("Step has to be applied to node set");

						n = alloc_node(ast_step, n, axis_descendant_or_self, nodetest_type_node, 0);
						if (!n) return 0;
					}

					// select from location path
					return parse_relative_location_path(n);
				}

				return n;
			}
			else if (_lexer.current() == lex_minus)
			{
				_lexer.next();

				// precedence 7+ - only parses union expressions
				xpath_ast_node* n = parse_expression(7);
				if (!n) return 0;

				return alloc_node(ast_op_negate, xpath_type_number, n);
			}
			else
			{
				return parse_location_path();
			}
		}